

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvn.cpp
# Opt level: O0

int __thiscall ncnn::MVN::forward(MVN *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  bool bVar2;
  float *pfVar3;
  long in_RSI;
  long in_RDI;
  double dVar4;
  int i_5;
  float norm_var_inv_1;
  float norm_var_1;
  float sqmean_1;
  float *outptr_3;
  int q_7;
  int i_4;
  float *outptr_2;
  int q_6;
  float norm_var_inv;
  float norm_var;
  int q_5;
  float sqmean;
  int i_3;
  float s_1;
  float *ptr_3;
  int q_4;
  Mat sqsum;
  int i_2;
  float mean_1;
  float *outptr_1;
  float *ptr_2;
  int q_3;
  int i_1;
  float *outptr;
  float *ptr_1;
  int q_2;
  int q_1;
  float mean;
  int i;
  float s;
  float *ptr;
  int q;
  Mat sum;
  int size;
  size_t elemsize;
  int channels;
  int h;
  int w;
  undefined4 in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc1c;
  Mat *in_stack_fffffffffffffc20;
  Mat *in_stack_fffffffffffffc28;
  Mat *in_stack_fffffffffffffc30;
  int in_stack_fffffffffffffc38;
  int in_stack_fffffffffffffc3c;
  Mat *in_stack_fffffffffffffc40;
  int local_338;
  Mat local_328;
  Mat *local_2f0;
  int local_2e8;
  int local_2e4;
  Mat local_2e0;
  float *local_2a8;
  int local_29c;
  float local_298;
  float local_294;
  int local_290;
  float local_28c;
  int local_288;
  float local_284;
  Mat local_280;
  float *local_248;
  int local_23c;
  Mat local_238;
  int local_200;
  float local_1fc;
  Mat local_1f8;
  float *local_1c0;
  Mat local_1b8;
  float *local_180;
  int local_178;
  int local_174;
  Mat local_170;
  float *local_138;
  Mat local_130;
  float *local_f8;
  int local_ec;
  int local_e8;
  float local_e4;
  int local_e0;
  float local_dc;
  Mat local_d8;
  float *local_a0;
  int local_94;
  int local_90;
  Mat local_80;
  int local_44;
  undefined8 local_40;
  int local_34;
  int local_30;
  int local_2c;
  int local_4;
  
  local_2c = *(int *)(in_RSI + 0x24);
  local_30 = *(int *)(in_RSI + 0x28);
  local_34 = *(int *)(in_RSI + 0x2c);
  local_40 = *(undefined8 *)(in_RSI + 0x10);
  local_44 = local_2c * local_30;
  Mat::create(in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38,
              (int)((ulong)in_stack_fffffffffffffc30 >> 0x20),(size_t)in_stack_fffffffffffffc28,
              (Allocator *)in_stack_fffffffffffffc20);
  bVar2 = Mat::empty(in_stack_fffffffffffffc20);
  if (bVar2) {
    return -100;
  }
  Mat::Mat(in_stack_fffffffffffffc30,(int)((ulong)in_stack_fffffffffffffc28 >> 0x20),
           (size_t)in_stack_fffffffffffffc20,
           (Allocator *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  bVar2 = Mat::empty(in_stack_fffffffffffffc20);
  if (bVar2) {
    local_4 = -100;
    local_90 = 1;
  }
  else {
    for (local_94 = 0; local_94 < local_34; local_94 = local_94 + 1) {
      Mat::channel(in_stack_fffffffffffffc28,(int)((ulong)in_stack_fffffffffffffc20 >> 0x20));
      pfVar3 = Mat::operator_cast_to_float_(&local_d8);
      Mat::~Mat((Mat *)0x11fa48);
      local_dc = 0.0;
      for (local_e0 = 0; fVar1 = local_dc, local_e0 < local_44; local_e0 = local_e0 + 1) {
        local_dc = pfVar3[local_e0] + local_dc;
      }
      local_a0 = pfVar3;
      pfVar3 = Mat::operator[](&local_80,local_94);
      *pfVar3 = fVar1;
    }
    if (*(int *)(in_RDI + 0x84) == 0) {
      for (local_178 = 0; local_178 < local_34; local_178 = local_178 + 1) {
        Mat::channel(in_stack_fffffffffffffc28,(int)((ulong)in_stack_fffffffffffffc20 >> 0x20));
        pfVar3 = Mat::operator_cast_to_float_(&local_1b8);
        Mat::~Mat((Mat *)0x11fdcb);
        local_180 = pfVar3;
        Mat::channel(in_stack_fffffffffffffc28,(int)((ulong)in_stack_fffffffffffffc20 >> 0x20));
        pfVar3 = Mat::operator_cast_to_float_(&local_1f8);
        Mat::~Mat((Mat *)0x11fe17);
        local_1c0 = pfVar3;
        pfVar3 = Mat::operator[](&local_80,local_178);
        local_1fc = *pfVar3 / (float)local_44;
        for (local_200 = 0; local_200 < local_44; local_200 = local_200 + 1) {
          local_1c0[local_200] = local_180[local_200] - local_1fc;
        }
      }
    }
    else {
      local_e4 = 0.0;
      for (local_e8 = 0; local_e8 < local_34; local_e8 = local_e8 + 1) {
        pfVar3 = Mat::operator[](&local_80,local_e8);
        local_e4 = *pfVar3 + local_e4;
      }
      local_e4 = local_e4 / (float)(local_34 * local_44);
      for (local_ec = 0; local_ec < local_34; local_ec = local_ec + 1) {
        Mat::channel(in_stack_fffffffffffffc28,(int)((ulong)in_stack_fffffffffffffc20 >> 0x20));
        pfVar3 = Mat::operator_cast_to_float_(&local_130);
        Mat::~Mat((Mat *)0x11fc46);
        local_f8 = pfVar3;
        Mat::channel(in_stack_fffffffffffffc28,(int)((ulong)in_stack_fffffffffffffc20 >> 0x20));
        pfVar3 = Mat::operator_cast_to_float_(&local_170);
        Mat::~Mat((Mat *)0x11fc92);
        for (local_174 = 0; local_174 < local_44; local_174 = local_174 + 1) {
          pfVar3[local_174] = local_f8[local_174] - local_e4;
        }
        local_138 = pfVar3;
      }
    }
    if (*(int *)(in_RDI + 0x80) != 0) {
      Mat::Mat(in_stack_fffffffffffffc30,(int)((ulong)in_stack_fffffffffffffc28 >> 0x20),
               (size_t)in_stack_fffffffffffffc20,
               (Allocator *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
      bVar2 = Mat::empty(in_stack_fffffffffffffc20);
      if (bVar2) {
        local_4 = -100;
        local_90 = 1;
      }
      else {
        for (local_23c = 0; local_23c < local_34; local_23c = local_23c + 1) {
          Mat::channel(in_stack_fffffffffffffc28,(int)((ulong)in_stack_fffffffffffffc20 >> 0x20));
          pfVar3 = Mat::operator_cast_to_float_(&local_280);
          Mat::~Mat((Mat *)0x120017);
          local_284 = 0.0;
          for (local_288 = 0; fVar1 = local_284, local_288 < local_44; local_288 = local_288 + 1) {
            local_284 = pfVar3[local_288] * pfVar3[local_288] + local_284;
          }
          local_248 = pfVar3;
          pfVar3 = Mat::operator[](&local_238,local_23c);
          *pfVar3 = fVar1;
        }
        if (*(int *)(in_RDI + 0x84) == 0) {
          for (local_2e8 = 0; local_2e8 < local_34; local_2e8 = local_2e8 + 1) {
            Mat::channel(in_stack_fffffffffffffc28,(int)((ulong)in_stack_fffffffffffffc20 >> 0x20));
            in_stack_fffffffffffffc28 = (Mat *)Mat::operator_cast_to_float_(&local_328);
            Mat::~Mat((Mat *)0x12037b);
            local_2f0 = in_stack_fffffffffffffc28;
            in_stack_fffffffffffffc20 = (Mat *)Mat::operator[](&local_238,local_2e8);
            dVar4 = std::sqrt((double)(ulong)(uint)(*(float *)&in_stack_fffffffffffffc20->data /
                                                   (float)local_44));
            fVar1 = *(float *)(in_RDI + 0x88);
            for (local_338 = 0; local_338 < local_44; local_338 = local_338 + 1) {
              *(float *)((long)&local_2f0->data + (long)local_338 * 4) =
                   *(float *)((long)&local_2f0->data + (long)local_338 * 4) *
                   (1.0 / (SUB84(dVar4,0) + fVar1));
            }
          }
        }
        else {
          local_28c = 0.0;
          for (local_290 = 0; local_290 < local_34; local_290 = local_290 + 1) {
            pfVar3 = Mat::operator[](&local_238,local_290);
            local_28c = *pfVar3 + local_28c;
          }
          local_28c = local_28c / (float)(local_34 * local_44);
          dVar4 = std::sqrt((double)(ulong)(uint)local_28c);
          local_294 = SUB84(dVar4,0) + *(float *)(in_RDI + 0x88);
          local_298 = 1.0 / local_294;
          for (local_29c = 0; local_29c < local_34; local_29c = local_29c + 1) {
            Mat::channel(in_stack_fffffffffffffc28,(int)((ulong)in_stack_fffffffffffffc20 >> 0x20));
            pfVar3 = Mat::operator_cast_to_float_(&local_2e0);
            Mat::~Mat((Mat *)0x12026c);
            for (local_2e4 = 0; local_2e4 < local_44; local_2e4 = local_2e4 + 1) {
              pfVar3[local_2e4] = pfVar3[local_2e4] * local_298;
            }
            local_2a8 = pfVar3;
          }
        }
        local_90 = 0;
      }
      Mat::~Mat((Mat *)0x1204c7);
      if (local_90 != 0) goto LAB_001204fb;
    }
    local_4 = 0;
    local_90 = 1;
  }
LAB_001204fb:
  Mat::~Mat((Mat *)0x120508);
  return local_4;
}

Assistant:

int MVN::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    top_blob.create(w, h, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // prepare sum per channel
    Mat sum(channels, elemsize, opt.workspace_allocator);
    if (sum.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        const float* ptr = bottom_blob.channel(q);

        float s = 0.f;
        for (int i=0; i<size; i++)
        {
            s += ptr[i];
        }

        sum[q] = s;
    }

    if (across_channels)
    {
        // compute mean across channels
        float mean = 0.f;
        for (int q=0; q<channels; q++)
        {
            mean += sum[q];
        }
        mean = mean / (channels * size);

        // subtract mean
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = ptr[i] - mean;
            }
        }
    }
    else
    {
        // subtract mean
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            float mean = sum[q] / size;

            for (int i=0; i<size; i++)
            {
                outptr[i] = ptr[i] - mean;
            }
        }
    }

    if (normalize_variance)
    {
        // prepare squared sum per channel
        Mat sqsum(channels, elemsize, opt.workspace_allocator);
        if (sqsum.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = top_blob.channel(q);

            float s = 0.f;
            for (int i=0; i<size; i++)
            {
                s += ptr[i] * ptr[i];
            }

            sqsum[q] = s;
        }

        if (across_channels)
        {
            // compute squared mean across channels
            float sqmean = 0.f;
            for (int q=0; q<channels; q++)
            {
                sqmean += sqsum[q];
            }
            sqmean = sqmean / (channels * size);

            // normalize variance
            float norm_var = sqrt(sqmean) + eps;
            float norm_var_inv = 1.f / norm_var;

            // apply normalize_variance
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                float* outptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = outptr[i] * norm_var_inv;
                }
            }
        }
        else
        {
            // apply normalize_variance
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                float* outptr = top_blob.channel(q);
                float sqmean = sqsum[q] / size;
                float norm_var = sqrt(sqmean) + eps;
                float norm_var_inv = 1.f / norm_var;

                for (int i=0; i<size; i++)
                {
                    outptr[i] = outptr[i] * norm_var_inv;
                }
            }
        }

    }

    return 0;
}